

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

Span<char> __thiscall Potassco::StringBuilder::toSpan(StringBuilder *this)

{
  byte bVar1;
  Span<char> SVar2;
  Span<char> SVar3;
  
  bVar1 = (this->field_0).sbo_[0x3f] & 0xc0;
  if (bVar1 == 0x40) {
    SVar2.first = (((this->field_0).str_)->_M_dataplus)._M_p;
    SVar2.size = ((this->field_0).str_)->_M_string_length;
    return SVar2;
  }
  if (bVar1 == 0x80) {
    return *(Span<char> *)&this->field_0;
  }
  SVar3.size = 0x3f - (ulong)(byte)(this->field_0).sbo_[0x3f];
  SVar3.first = (char *)this;
  return SVar3;
}

Assistant:

Span<char> StringBuilder::toSpan() const {
	Buffer x = buffer();
	return Potassco::toSpan(x.head, x.used);
}